

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_flags.c
# Opt level: O3

int main(void)

{
  printf("-DLIN64 ");
  printf("-DSIZEOF_VOID_P=%d -DSIZEOF_LONG=%d -DSIZEOF_INT=%d\n",8,8,4);
  return 0;
}

Assistant:

int main()
{
    if (sizeof(void*) == 8)     // Assume 64-bit Linux if pointers are 8 bytes.
        printf("-DLIN64 ");
    else
        printf("-DLIN ");

    printf("-DSIZEOF_VOID_P=%d -DSIZEOF_LONG=%d -DSIZEOF_INT=%d\n",
           (int)sizeof(void*),
           (int)sizeof(long),
           (int)sizeof(int) );


    return 0;
}